

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O0

char * Curl_mime_contenttype(char *filename)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t len2;
  uint i;
  char *nameend;
  size_t len1;
  char *filename_local;
  
  if (filename != (char *)0x0) {
    sVar2 = strlen(filename);
    for (len2._4_4_ = 0; len2._4_4_ < 10; len2._4_4_ = len2._4_4_ + 1) {
      sVar3 = strlen(Curl_mime_contenttype::ctts[len2._4_4_].extension);
      if ((sVar3 <= sVar2) &&
         (iVar1 = Curl_strcasecompare(filename + (sVar2 - sVar3),
                                      Curl_mime_contenttype::ctts[len2._4_4_].extension), iVar1 != 0
         )) {
        return Curl_mime_contenttype::ctts[len2._4_4_].type;
      }
    }
  }
  return (char *)0x0;
}

Assistant:

const char *Curl_mime_contenttype(const char *filename)
{
  /*
   * If no content type was specified, we scan through a few well-known
   * extensions and pick the first we match!
   */
  struct ContentType {
    const char *extension;
    const char *type;
  };
  static const struct ContentType ctts[] = {
    {".gif",  "image/gif"},
    {".jpg",  "image/jpeg"},
    {".jpeg", "image/jpeg"},
    {".png",  "image/png"},
    {".svg",  "image/svg+xml"},
    {".txt",  "text/plain"},
    {".htm",  "text/html"},
    {".html", "text/html"},
    {".pdf",  "application/pdf"},
    {".xml",  "application/xml"}
  };

  if(filename) {
    size_t len1 = strlen(filename);
    const char *nameend = filename + len1;
    unsigned int i;

    for(i = 0; i < sizeof(ctts) / sizeof(ctts[0]); i++) {
      size_t len2 = strlen(ctts[i].extension);

      if(len1 >= len2 && strcasecompare(nameend - len2, ctts[i].extension))
          return ctts[i].type;
    }
  }
  return NULL;
}